

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O0

void __thiscall wasm::Flatten::visitExpression(Flatten *this,Expression *curr)

{
  allocator<wasm::Expression_*> *this_00;
  MixedArena *pMVar1;
  bool bVar2;
  Index IVar3;
  int iVar4;
  Index index;
  Module *pMVar5;
  id *this_01;
  Expression **ppEVar6;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *this_02;
  pointer ppVar7;
  LocalSet *pLVar8;
  If *this_03;
  Loop *this_04;
  Try *this_05;
  ulong uVar9;
  size_t sVar10;
  reference ppEVar11;
  pointer ppVar12;
  Type type_00;
  Break *this_06;
  undefined4 extraout_var;
  reference pNVar13;
  Fatal *this_07;
  Expression *pEVar14;
  Function *pFVar15;
  LocalGet *pLVar16;
  mapped_type *pmVar17;
  reference ppEVar18;
  Iterator IVar19;
  Iterator __last;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  optional<wasm::Type> type__02;
  optional<wasm::Type> type__03;
  Expression *local_648;
  Expression *local_640;
  Expression *prelude_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range4_1;
  mapped_type *parentPreludes;
  Expression *parent;
  LocalSet *local_608;
  uintptr_t local_600;
  Index local_5f4;
  Type TStack_5f0;
  Index temp_6;
  Type type_6;
  char *local_5e0;
  Fatal local_5d8;
  BasicType local_44c;
  uintptr_t local_448;
  uintptr_t local_440;
  size_t local_438;
  char *pcStack_430;
  LocalSet *local_420;
  size_t sStack_418;
  Name name;
  _Self local_400;
  iterator __end8;
  iterator __begin8;
  NameSet *__range8;
  NameSet names;
  Type TStack_3a0;
  Index temp_5;
  Type type_5;
  Switch *sw;
  uintptr_t local_388;
  Break *local_380;
  LocalSet *local_378;
  uintptr_t local_370;
  LocalSet *local_368;
  uintptr_t local_360;
  size_t local_358;
  char *pcStack_350;
  Index local_33c;
  size_t sStack_338;
  Index temp_4;
  char *pcStack_330;
  Type local_328;
  Type blockType;
  Type type_4;
  Break *br;
  Type localType;
  BasicType local_2f4;
  LocalSet *local_2f0;
  LocalSet *set;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
  local_2e0;
  iterator iter_2;
  undefined1 local_2d0 [12];
  uint local_2bc;
  Try *pTStack_2b8;
  Index i_1;
  uintptr_t local_2b0;
  uint local_2a4;
  uintptr_t uStack_2a0;
  Index i;
  Index local_294;
  Type TStack_290;
  Index temp_3;
  Type type_3;
  undefined1 local_260 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> originalCatchBodies;
  Expression *originalBody_1;
  Expression *rep_3;
  Try *tryy;
  undefined1 local_228 [12];
  Type local_218;
  Loop *local_210;
  uintptr_t local_208;
  uintptr_t local_200;
  Index local_1f4;
  Type TStack_1f0;
  Index temp_2;
  Type type_2;
  Expression *originalBody;
  Expression *rep_2;
  Loop *loop;
  undefined1 local_1c8 [12];
  uintptr_t local_1b8;
  uintptr_t local_1b0;
  Index local_1a4;
  Expression *pEStack_1a0;
  Index temp_1;
  Expression *prelude_1;
  uintptr_t local_190;
  Type local_188;
  Type type_1;
  Expression *originalIfFalse;
  Expression *originalIfTrue;
  Expression *rep_1;
  If *iff;
  undefined1 local_158 [12];
  MixedArena *local_148;
  uintptr_t local_140;
  LocalGet *local_138;
  LocalGet *rep;
  undefined1 local_128 [12];
  Expression **local_118;
  Expression **last;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_108;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_100;
  iterator iter_1;
  Type TStack_f0;
  Index temp;
  Type type;
  Expression *prelude;
  iterator __end6;
  iterator __begin6;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range6;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *itemPreludes;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
  local_b8;
  iterator iter;
  Expression *item;
  Iterator __end4;
  Iterator __begin4;
  ExpressionList *__range4;
  ExpressionList newList;
  Block *block;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
  local_50;
  undefined4 local_48;
  Builder local_38;
  Builder builder;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> ourPreludes;
  Expression *curr_local;
  Flatten *this_local;
  
  ourPreludes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
  pMVar5 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::getModule
                     ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *
                      )&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     );
  Builder::Builder(&local_38,pMVar5);
  bVar2 = Properties::isConstantExpression
                    ((Expression *)
                     ourPreludes.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((bVar2) ||
     (bVar2 = Expression::is<wasm::Nop>
                        ((Expression *)
                         ourPreludes.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2)) {
    local_48 = 1;
  }
  else {
    bVar2 = Properties::isControlFlowStructure
                      ((Expression *)
                       ourPreludes.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
           ::find(&this->preludes,
                  (key_type *)
                  &ourPreludes.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      block = (Block *)std::
                       unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                       ::end(&this->preludes);
      bVar2 = std::__detail::operator==
                        (&local_50,
                         (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                          *)&block);
      if (!bVar2) {
        __assert_fail("preludes.find(curr) == preludes.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                      ,0x66,"void wasm::Flatten::visitExpression(Expression *)");
      }
      newList.allocator =
           (MixedArena *)
           Expression::dynCast<wasm::Block>
                     ((Expression *)
                      ourPreludes.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((Block *)newList.allocator == (Block *)0x0) {
        this_03 = Expression::dynCast<wasm::If>
                            ((Expression *)
                             ourPreludes.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (this_03 == (If *)0x0) {
          this_04 = Expression::dynCast<wasm::Loop>
                              ((Expression *)
                               ourPreludes.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (this_04 == (Loop *)0x0) {
            this_05 = Expression::dynCast<wasm::Try>
                                ((Expression *)
                                 ourPreludes.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (this_05 == (Try *)0x0) {
              handle_unreachable("unexpected expr type",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                                 ,0xe7);
            }
            originalCatchBodies.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)this_05->body;
            IVar19 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                               (&(this_05->catchBodies).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               );
            __last = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                               (&(this_05->catchBodies).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               );
            this_00 = (allocator<wasm::Expression_*> *)((long)&type_3.id + 7);
            std::allocator<wasm::Expression_*>::allocator(this_00);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            vector<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,void>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_260,
                       IVar19,__last,this_00);
            std::allocator<wasm::Expression_*>::~allocator
                      ((allocator<wasm::Expression_*> *)((long)&type_3.id + 7));
            TStack_290.id =
                 (this_05->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type
                 .id;
            bVar2 = wasm::Type::isConcrete(&stack0xfffffffffffffd70);
            originalBody_1 = (Expression *)this_05;
            if (bVar2) {
              pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        ::getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       *)&(this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     );
              uStack_2a0 = TStack_290.id;
              local_294 = Builder::addVar(pFVar15,TStack_290);
              bVar2 = wasm::Type::isConcrete(&this_05->body->type);
              if (bVar2) {
                pLVar8 = Builder::makeLocalSet(&local_38,local_294,this_05->body);
                this_05->body = (Expression *)pLVar8;
              }
              for (local_2a4 = 0; uVar9 = (ulong)local_2a4,
                  sVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                           size(&(this_05->catchBodies).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ), uVar9 < sVar10; local_2a4 = local_2a4 + 1) {
                ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                          operator[](&(this_05->catchBodies).
                                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     ,(ulong)local_2a4);
                bVar2 = wasm::Type::isConcrete(&(*ppEVar6)->type);
                IVar3 = local_294;
                if (bVar2) {
                  ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            operator[](&(this_05->catchBodies).
                                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       ,(ulong)local_2a4);
                  pLVar8 = Builder::makeLocalSet(&local_38,IVar3,*ppEVar6);
                  ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            operator[](&(this_05->catchBodies).
                                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       ,(ulong)local_2a4);
                  *ppEVar6 = (Expression *)pLVar8;
                }
              }
              local_2b0 = TStack_290.id;
              originalBody_1 = (Expression *)Builder::makeLocalGet(&local_38,local_294,TStack_290);
              pTStack_2b8 = this_05;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&stack0xfffffffffffffd48);
            }
            pEVar14 = getPreludesWithExpression
                                (this,(Expression *)
                                      originalCatchBodies.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 this_05->body);
            this_05->body = pEVar14;
            for (local_2bc = 0; uVar9 = (ulong)local_2bc,
                sVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                   (&(this_05->catchBodies).
                                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ), uVar9 < sVar10; local_2bc = local_2bc + 1) {
              ppEVar11 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                         operator[]((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)local_260,(ulong)local_2bc);
              pEVar14 = *ppEVar11;
              ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[](&(this_05->catchBodies).
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ,(ulong)local_2bc);
              pEVar14 = getPreludesWithExpression(this,pEVar14,*ppEVar6);
              ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[](&(this_05->catchBodies).
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ,(ulong)local_2bc);
              *ppEVar6 = pEVar14;
            }
            std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_2d0);
            type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._12_4_ = 0;
            type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)local_2d0._0_8_;
            type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_2d0[8];
            type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._9_3_ = local_2d0._9_3_;
            Try::finalize(this_05,type__03);
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,originalBody_1);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_260)
            ;
          }
          else {
            type_2.id = (uintptr_t)this_04->body;
            TStack_1f0.id =
                 (this_04->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.
                 id;
            bVar2 = wasm::Type::isConcrete(&stack0xfffffffffffffe10);
            originalBody = (Expression *)this_04;
            if (bVar2) {
              pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        ::getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       *)&(this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     );
              local_200 = TStack_1f0.id;
              local_1f4 = Builder::addVar(pFVar15,TStack_1f0);
              pLVar8 = Builder::makeLocalSet(&local_38,local_1f4,this_04->body);
              this_04->body = (Expression *)pLVar8;
              local_208 = TStack_1f0.id;
              originalBody = (Expression *)Builder::makeLocalGet(&local_38,local_1f4,TStack_1f0);
              local_210 = this_04;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&local_210);
              wasm::Type::Type(&local_218,none);
              (this_04->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id
                   = local_218.id;
            }
            pEVar14 = getPreludesWithExpression(this,(Expression *)type_2.id,this_04->body);
            this_04->body = pEVar14;
            std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_228);
            type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._12_4_ = 0;
            type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)local_228._0_8_;
            type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_228[8];
            type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._9_3_ = local_228._9_3_;
            Loop::finalize(this_04,type__02);
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,originalBody);
          }
        }
        else {
          originalIfTrue = getPreludesWithExpression(this,this_03->condition,(Expression *)this_03);
          pEVar14 = this_03->ifTrue;
          type_1.id = (uintptr_t)this_03->ifFalse;
          if (this_03->ifFalse == (Expression *)0x0) {
            wasm::Type::Type(&local_188,none);
          }
          else {
            local_190 = (this_03->ifTrue->type).id;
            prelude_1 = (Expression *)(this_03->ifFalse->type).id;
            local_188 = wasm::Type::getLeastUpperBound(local_190,(Type)prelude_1);
          }
          pEStack_1a0 = (Expression *)0x0;
          bVar2 = wasm::Type::isConcrete(&local_188);
          if (bVar2) {
            pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                      getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   *)&(this->
                                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                      ).
                                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 );
            local_1b0 = local_188.id;
            local_1a4 = Builder::addVar(pFVar15,local_188);
            bVar2 = wasm::Type::isConcrete(&this_03->ifTrue->type);
            if (bVar2) {
              pLVar8 = Builder::makeLocalSet(&local_38,local_1a4,this_03->ifTrue);
              this_03->ifTrue = (Expression *)pLVar8;
            }
            bVar2 = wasm::Type::isConcrete(&this_03->ifFalse->type);
            if (bVar2) {
              pLVar8 = Builder::makeLocalSet(&local_38,local_1a4,this_03->ifFalse);
              this_03->ifFalse = (Expression *)pLVar8;
            }
            bVar2 = wasm::Type::isConcrete
                              ((Type *)(ourPreludes.
                                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            if (bVar2) {
              local_1b8 = local_188.id;
              pEStack_1a0 = originalIfTrue;
              originalIfTrue = (Expression *)Builder::makeLocalGet(&local_38,local_1a4,local_188);
            }
          }
          pEVar14 = getPreludesWithExpression(this,pEVar14,this_03->ifTrue);
          this_03->ifTrue = pEVar14;
          if (this_03->ifFalse != (Expression *)0x0) {
            pEVar14 = getPreludesWithExpression(this,(Expression *)type_1.id,this_03->ifFalse);
            this_03->ifFalse = pEVar14;
          }
          std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_1c8);
          type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._12_4_ = 0;
          type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)local_1c8._0_8_;
          type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1c8[8];
          type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_3_ = local_1c8._9_3_;
          If::finalize(this_03,type__01);
          if (pEStack_1a0 != (Expression *)0x0) {
            Visitor<wasm::ReFinalizeNode,_void>::visit
                      ((Visitor<wasm::ReFinalizeNode,_void> *)((long)&loop + 6),pEStack_1a0);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                       &stack0xfffffffffffffe60);
          }
          ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
          ::replaceCurrent(&(this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                           ,originalIfTrue);
        }
      }
      else {
        pMVar5 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                 getModule((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          );
        ArenaVector<wasm::Expression_*>::ArenaVector
                  ((ArenaVector<wasm::Expression_*> *)&__range4,&pMVar5->allocator);
        this_01 = &(newList.allocator)->threadId;
        IVar19 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            this_01);
        __end4.index = (size_t)IVar19.parent;
        IVar19 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            this_01);
        while( true ) {
          __end4.parent = (ArenaVector<wasm::Expression_*> *)IVar19.index;
          item = (Expression *)IVar19.parent;
          bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator!=((Iterator *)&__end4.index,(Iterator *)&item);
          if (!bVar2) break;
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                    operator*((Iterator *)&__end4.index);
          iter.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
          ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                     )*ppEVar6;
          local_b8._M_cur =
               (__node_type *)
               std::
               unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
               ::find(&this->preludes,(key_type *)&iter);
          itemPreludes = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         std::
                         unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                         ::end(&this->preludes);
          bVar2 = std::__detail::operator!=
                            (&local_b8,
                             (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                              *)&itemPreludes);
          if (bVar2) {
            ppVar12 = std::__detail::
                      _Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
                      ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
                                    *)&local_b8);
            this_02 = &ppVar12->second;
            __end6 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                               (this_02);
            prelude = (Expression *)
                      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                                (this_02);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                               *)&prelude), bVar2) {
              ppEVar18 = __gnu_cxx::
                         __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                         ::operator*(&__end6);
              type.id = (uintptr_t)*ppEVar18;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         &__range4,(Expression *)type.id);
              __gnu_cxx::
              __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator++(&__end6);
            }
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::clear(this_02);
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     &__range4,
                     (Expression *)
                     iter.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                     ._M_cur);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                    ((Iterator *)&__end4.index);
          IVar19.index = (size_t)__end4.parent;
          IVar19.parent = (ArenaVector<wasm::Expression_*> *)item;
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::swap
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   &(newList.allocator)->threadId,(ArenaVector<wasm::Expression_*> *)&__range4);
        TStack_f0.id = (uintptr_t)
                       ((newList.allocator)->chunks).
                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
        bVar2 = wasm::Type::isConcrete(&stack0xffffffffffffff10);
        if (bVar2) {
          local_100._M_cur =
               (__node_type *)
               std::
               unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               ::find(&this->breakTemps,
                      (key_type *)
                      &((newList.allocator)->chunks).
                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
          local_108._M_cur =
               (__node_type *)
               std::
               unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               ::end(&this->breakTemps);
          bVar2 = std::__detail::operator!=(&local_100,&local_108);
          if (bVar2) {
            ppVar7 = std::__detail::
                     _Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::
                     operator->((_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>
                                 *)&local_100);
            iter_1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur
            ._4_4_ = ppVar7->second;
          }
          else {
            pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                      getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   *)&(this->
                                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                      ).
                                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 );
            last = (Expression **)TStack_f0.id;
            iter_1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur
            ._4_4_ = Builder::addVar(pFVar15,TStack_f0);
          }
          local_118 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)&(newList.allocator)->threadId);
          bVar2 = wasm::Type::isConcrete(&(*local_118)->type);
          if (bVar2) {
            pLVar8 = Builder::makeLocalSet
                               (&local_38,
                                iter_1.
                                super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>
                                ._M_cur._4_4_,*local_118);
            *local_118 = (Expression *)pLVar8;
          }
          pMVar1 = newList.allocator;
          rep._4_4_ = 0;
          std::optional<wasm::Type>::optional<wasm::Type::BasicType,_true>
                    ((optional<wasm::Type> *)local_128,(BasicType *)((long)&rep + 4));
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._12_4_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)local_128._0_8_;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_128[8];
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_3_ = local_128._9_3_;
          Block::finalize((Block *)pMVar1,type_,Unknown);
          local_140 = TStack_f0.id;
          local_138 = Builder::makeLocalGet
                                (&local_38,
                                 iter_1.
                                 super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>
                                 ._M_cur._4_4_,TStack_f0);
          ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
          ::replaceCurrent(&(this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                           ,(Expression *)local_138);
          local_148 = newList.allocator;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                     (value_type *)&local_148);
        }
        pMVar1 = newList.allocator;
        iff._4_4_ = 0;
        std::optional<wasm::Type>::optional<wasm::Type::BasicType,_true>
                  ((optional<wasm::Type> *)local_158,(BasicType *)((long)&iff + 4));
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._12_4_ = 0;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)local_158._0_8_;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_158[8];
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_3_ = local_158._9_3_;
        Block::finalize((Block *)pMVar1,type__00,Unknown);
      }
    }
    else {
      local_2e0._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
           ::find(&this->preludes,
                  (key_type *)
                  &ourPreludes.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      set = (LocalSet *)
            std::
            unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
            ::end(&this->preludes);
      bVar2 = std::__detail::operator!=
                        (&local_2e0,
                         (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                          *)&set);
      if (bVar2) {
        ppVar12 = std::__detail::
                  _Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
                  ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
                                *)&local_2e0);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::swap
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                   &ppVar12->second);
      }
      local_2f0 = Expression::dynCast<wasm::LocalSet>
                            ((Expression *)
                             ourPreludes.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_2f0 == (LocalSet *)0x0) {
        this_06 = Expression::dynCast<wasm::Break>
                            ((Expression *)
                             ourPreludes.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (this_06 == (Break *)0x0) {
          type_5.id = (uintptr_t)
                      Expression::dynCast<wasm::Switch>
                                ((Expression *)
                                 ourPreludes.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (((Switch *)type_5.id != (Switch *)0x0) &&
             (((Switch *)type_5.id)->value != (Expression *)0x0)) {
            TStack_3a0.id = (((Switch *)type_5.id)->value->type).id;
            bVar2 = wasm::Type::isConcrete(&stack0xfffffffffffffc60);
            if (bVar2) {
              pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        ::getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       *)&(this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     );
              IVar3 = Builder::addVar(pFVar15,TStack_3a0);
              names._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)Builder::makeLocalSet(&local_38,IVar3,*(Expression **)(type_5.id + 0x40))
              ;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&names._M_t._M_impl.super__Rb_tree_header._M_node_count);
              BranchUtils::getUniqueTargets((NameSet *)&__range8,(Expression *)type_5.id);
              __end8 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::
                       begin((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                             &__range8);
              local_400._M_node =
                   (_Base_ptr)
                   std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                             ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *
                              )&__range8);
              while (bVar2 = std::operator!=(&__end8,&local_400), bVar2) {
                pNVar13 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end8);
                local_438 = (pNVar13->super_IString).str._M_len;
                pcStack_430 = (pNVar13->super_IString).str._M_str;
                local_440 = TStack_3a0.id;
                sStack_418 = local_438;
                name.super_IString.str._M_len = (size_t)pcStack_430;
                index = getTempForBreakTarget(this,(Name)(pNVar13->super_IString).str,TStack_3a0);
                local_448 = TStack_3a0.id;
                pLVar16 = Builder::makeLocalGet(&local_38,IVar3,TStack_3a0);
                local_420 = Builder::makeLocalSet(&local_38,index,(Expression *)pLVar16);
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &builder,(value_type *)&local_420);
                std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end8);
              }
              *(undefined8 *)(type_5.id + 0x40) = 0;
              Switch::finalize((Switch *)type_5.id);
              std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
                        ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                         &__range8);
            }
            else {
              local_44c = unreachable;
              bVar2 = wasm::Type::operator==(&stack0xfffffffffffffc60,&local_44c);
              if (!bVar2) {
                __assert_fail("type == Type::unreachable",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                              ,0x148,"void wasm::Flatten::visitExpression(Expression *)");
              }
              ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
              ::replaceCurrent(&(this->
                                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                ).
                                super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               ,*(Expression **)(type_5.id + 0x40));
            }
          }
        }
        else if (this_06->value != (Expression *)0x0) {
          blockType.id = (this_06->value->type).id;
          bVar2 = wasm::Type::isConcrete(&blockType);
          if (bVar2) {
            sStack_338 = (this_06->name).super_IString.str._M_len;
            pcStack_330 = (this_06->name).super_IString.str._M_str;
            pEVar14 = ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                      ::findBreakTarget(&(this->
                                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                         ).
                                         super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                        ,(Name)(this_06->name).super_IString.str);
            local_360 = (pEVar14->type).id;
            local_358 = (this_06->name).super_IString.str._M_len;
            pcStack_350 = (this_06->name).super_IString.str._M_str;
            local_328.id = local_360;
            local_33c = getTempForBreakTarget
                                  (this,(Name)(this_06->name).super_IString.str,(Type)local_360);
            local_368 = Builder::makeLocalSet(&local_38,local_33c,this_06->value);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                       (value_type *)&local_368);
            bVar2 = wasm::Type::operator!=(&blockType,&local_328);
            if (bVar2) {
              pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        ::getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       *)&(this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     );
              local_370 = blockType.id;
              IVar3 = Builder::addVar(pFVar15,blockType);
              pEVar14 = this_06->value;
              local_33c = IVar3;
              pMVar5 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                       getModule((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                  *)&(this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                );
              iVar4 = ExpressionManipulator::copy((EVP_PKEY_CTX *)pEVar14,(EVP_PKEY_CTX *)pMVar5);
              local_378 = Builder::makeLocalSet
                                    (&local_38,IVar3,(Expression *)CONCAT44(extraout_var,iVar4));
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&local_378);
            }
            if (this_06->condition != (Expression *)0x0) {
              local_380 = this_06;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&local_380);
              bVar2 = wasm::Type::isConcrete
                                (&(this_06->super_SpecificExpression<(wasm::Expression::Id)4>).
                                  super_Expression.type);
              if (bVar2) {
                local_388 = blockType.id;
                pLVar16 = Builder::makeLocalGet(&local_38,local_33c,blockType);
                ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                ::replaceCurrent(&(this->
                                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                  ).
                                  super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 ,(Expression *)pLVar16);
              }
              else {
                sw._4_4_ = 1;
                bVar2 = wasm::Type::operator==
                                  (&(this_06->super_SpecificExpression<(wasm::Expression::Id)4>).
                                    super_Expression.type,(BasicType *)((long)&sw + 4));
                if (!bVar2) {
                  __assert_fail("br->type == Type::unreachable",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                                ,0x12a,"void wasm::Flatten::visitExpression(Expression *)");
                }
                pEVar14 = (Expression *)Builder::makeUnreachable(&local_38);
                ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                ::replaceCurrent(&(this->
                                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                  ).
                                  super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 ,pEVar14);
              }
            }
            this_06->value = (Expression *)0x0;
            Break::finalize(this_06);
          }
          else {
            sw._0_4_ = 1;
            bVar2 = wasm::Type::operator==(&blockType,(BasicType *)&sw);
            if (!bVar2) {
              __assert_fail("type == Type::unreachable",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                            ,0x131,"void wasm::Flatten::visitExpression(Expression *)");
            }
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,this_06->value);
          }
        }
      }
      else {
        bVar2 = LocalSet::isTee(local_2f0);
        if (bVar2) {
          local_2f4 = unreachable;
          bVar2 = wasm::Type::operator==(&local_2f0->value->type,&local_2f4);
          if (bVar2) {
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,local_2f0->value);
          }
          else {
            LocalSet::makeSet(local_2f0);
            localType.id = (uintptr_t)local_2f0;
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                       (value_type *)&localType);
            pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                      getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   *)&(this->
                                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                      ).
                                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 );
            type_00 = Function::getLocalType(pFVar15,local_2f0->index);
            pLVar16 = Builder::makeLocalGet(&local_38,local_2f0->index,type_00);
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,(Expression *)pLVar16);
          }
        }
      }
    }
    bVar2 = Expression::is<wasm::BrOn>
                      ((Expression *)
                       ourPreludes.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((bVar2) ||
       (bVar2 = Expression::is<wasm::TryTable>
                          ((Expression *)
                           ourPreludes.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2)) {
      Fatal::Fatal(&local_5d8);
      this_07 = Fatal::operator<<(&local_5d8,(char (*) [38])"Unsupported instruction for Flatten: ")
      ;
      local_5e0 = getExpressionName((Expression *)
                                    ourPreludes.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Fatal::operator<<(this_07,&local_5e0);
      Fatal::~Fatal(&local_5d8);
    }
    ourPreludes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                  getCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            );
    Visitor<wasm::ReFinalizeNode,_void>::visit
              ((Visitor<wasm::ReFinalizeNode,_void> *)((long)&type_6.id + 7),
               (Expression *)
               ourPreludes.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    type_6.id._0_4_ = 1;
    bVar2 = wasm::Type::operator==
                      ((Type *)(ourPreludes.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
                       (BasicType *)&type_6);
    if (bVar2) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                 (value_type *)
                 &ourPreludes.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      pEVar14 = (Expression *)Builder::makeUnreachable(&local_38);
      ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
      replaceCurrent(&(this->
                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                      ).
                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     ,pEVar14);
    }
    else {
      bVar2 = wasm::Type::isConcrete
                        ((Type *)(ourPreludes.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
      if (bVar2) {
        TStack_5f0.id =
             (uintptr_t)
             ourPreludes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[1];
        pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                  getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               *)&(this->
                                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                  ).
                                  super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             );
        local_600 = TStack_5f0.id;
        local_5f4 = Builder::addVar(pFVar15,TStack_5f0);
        local_608 = Builder::makeLocalSet
                              (&local_38,local_5f4,
                               (Expression *)
                               ourPreludes.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                   (value_type *)&local_608);
        parent = (Expression *)TStack_5f0.id;
        pLVar16 = Builder::makeLocalGet(&local_38,local_5f4,TStack_5f0);
        ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
        replaceCurrent(&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                       ,(Expression *)pLVar16);
      }
    }
    bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
    if (!bVar2) {
      parentPreludes =
           (mapped_type *)
           ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
           ::getParent(&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                      );
      if (((Expression *)parentPreludes == (Expression *)0x0) ||
         (bVar2 = Properties::isControlFlowStructure((Expression *)parentPreludes), bVar2)) {
        local_648 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                    getCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                *)&(this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              );
        pmVar17 = std::
                  unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                  ::operator[](&this->preludes,&local_648);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::swap
                  (pmVar17,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &builder);
      }
      else {
        pmVar17 = std::
                  unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                  ::operator[](&this->preludes,(key_type *)&parentPreludes);
        __end4_1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                             ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                              &builder);
        prelude_2 = (Expression *)
                    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &builder);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                   *)&prelude_2), bVar2) {
          ppEVar18 = __gnu_cxx::
                     __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                     ::operator*(&__end4_1);
          local_640 = *ppEVar18;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    (pmVar17,&local_640);
          __gnu_cxx::
          __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          ::operator++(&__end4_1);
        }
      }
    }
    local_48 = 0;
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    std::vector<Expression*> ourPreludes;
    Builder builder(*getModule());

    // Nothing to do for constants and nop.
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }

    if (Properties::isControlFlowStructure(curr)) {
      // handle control flow explicitly. our children do not have control flow,
      // but they do have preludes which we need to set up in the right place

      // no one should have given us preludes, they are on the children
      assert(preludes.find(curr) == preludes.end());

      if (auto* block = curr->dynCast<Block>()) {
        // make a new list, where each item's preludes are added before it
        ExpressionList newList(getModule()->allocator);
        for (auto* item : block->list) {
          auto iter = preludes.find(item);
          if (iter != preludes.end()) {
            auto& itemPreludes = iter->second;
            for (auto* prelude : itemPreludes) {
              newList.push_back(prelude);
            }
            itemPreludes.clear();
          }
          newList.push_back(item);
        }
        block->list.swap(newList);
        // remove a block return value
        auto type = block->type;
        if (type.isConcrete()) {
          // if there is a temp index for breaking to the block, use that
          Index temp;
          auto iter = breakTemps.find(block->name);
          if (iter != breakTemps.end()) {
            temp = iter->second;
          } else {
            temp = builder.addVar(getFunction(), type);
          }
          auto*& last = block->list.back();
          if (last->type.isConcrete()) {
            last = builder.makeLocalSet(temp, last);
          }
          block->finalize(Type::none);
          // and we leave just a get of the value
          auto* rep = builder.makeLocalGet(temp, type);
          replaceCurrent(rep);
          // the whole block is now a prelude
          ourPreludes.push_back(block);
        }
        // the block now has no return value, and may have become unreachable
        block->finalize(Type::none);

      } else if (auto* iff = curr->dynCast<If>()) {
        // condition preludes go before the entire if
        auto* rep = getPreludesWithExpression(iff->condition, iff);
        // arm preludes go in the arms. we must also remove an if value
        auto* originalIfTrue = iff->ifTrue;
        auto* originalIfFalse = iff->ifFalse;
        auto type = iff->ifFalse ? Type::getLeastUpperBound(iff->ifTrue->type,
                                                            iff->ifFalse->type)
                                 : Type::none;
        Expression* prelude = nullptr;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (iff->ifTrue->type.isConcrete()) {
            iff->ifTrue = builder.makeLocalSet(temp, iff->ifTrue);
          }
          if (iff->ifFalse->type.isConcrete()) {
            iff->ifFalse = builder.makeLocalSet(temp, iff->ifFalse);
          }
          if (curr->type.isConcrete()) {
            // the whole if (+any preludes from the condition) is now a prelude
            prelude = rep;
            // and we leave just a get of the value
            rep = builder.makeLocalGet(temp, type);
          }
        }
        iff->ifTrue = getPreludesWithExpression(originalIfTrue, iff->ifTrue);
        if (iff->ifFalse) {
          iff->ifFalse =
            getPreludesWithExpression(originalIfFalse, iff->ifFalse);
        }
        iff->finalize();
        if (prelude) {
          ReFinalizeNode().visit(prelude);
          ourPreludes.push_back(prelude);
        }
        replaceCurrent(rep);

      } else if (auto* loop = curr->dynCast<Loop>()) {
        // remove a loop value
        Expression* rep = loop;
        auto* originalBody = loop->body;
        auto type = loop->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          loop->body = builder.makeLocalSet(temp, loop->body);
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole if is now a prelude
          ourPreludes.push_back(loop);
          loop->type = Type::none;
        }
        loop->body = getPreludesWithExpression(originalBody, loop->body);
        loop->finalize();
        replaceCurrent(rep);

      } else if (auto* tryy = curr->dynCast<Try>()) {
        // remove a try value
        Expression* rep = tryy;
        auto* originalBody = tryy->body;
        std::vector<Expression*> originalCatchBodies(tryy->catchBodies.begin(),
                                                     tryy->catchBodies.end());
        auto type = tryy->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (tryy->body->type.isConcrete()) {
            tryy->body = builder.makeLocalSet(temp, tryy->body);
          }
          for (Index i = 0; i < tryy->catchBodies.size(); i++) {
            if (tryy->catchBodies[i]->type.isConcrete()) {
              tryy->catchBodies[i] =
                builder.makeLocalSet(temp, tryy->catchBodies[i]);
            }
          }
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole try is now a prelude
          ourPreludes.push_back(tryy);
        }
        tryy->body = getPreludesWithExpression(originalBody, tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = getPreludesWithExpression(
            originalCatchBodies[i], tryy->catchBodies[i]);
        }
        tryy->finalize();
        replaceCurrent(rep);

      } else {
        WASM_UNREACHABLE("unexpected expr type");
      }

    } else {
      // for anything else, there may be existing preludes
      auto iter = preludes.find(curr);
      if (iter != preludes.end()) {
        ourPreludes.swap(iter->second);
      }

      // special handling
      if (auto* set = curr->dynCast<LocalSet>()) {
        if (set->isTee()) {
          // we disallow local.tee
          if (set->value->type == Type::unreachable) {
            replaceCurrent(set->value); // trivial, no set happens
          } else {
            // use a set in a prelude + a get
            set->makeSet();
            ourPreludes.push_back(set);
            Type localType = getFunction()->getLocalType(set->index);
            replaceCurrent(builder.makeLocalGet(set->index, localType));
          }
        }

      } else if (auto* br = curr->dynCast<Break>()) {
        if (br->value) {
          auto type = br->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Type blockType = findBreakTarget(br->name)->type;
            Index temp = getTempForBreakTarget(br->name, blockType);
            ourPreludes.push_back(builder.makeLocalSet(temp, br->value));

            // br_if leaves a value on the stack if not taken, which later can
            // be the last element of the enclosing innermost block and flow
            // out. The local we created using 'getTempForBreakTarget' returns
            // the return type of the block this branch is targetting, which may
            // not be the same with the innermost block's return type. For
            // example,
            // (block $any (result anyref)
            //   (block (result funcref)
            //     (local.tee $0
            //       (br_if $any
            //         (ref.null func)
            //         (i32.const 0)
            //       )
            //     )
            //   )
            // )
            // In this case we need two locals to store (ref.null); one with
            // funcref type that's for the target block ($label0) and one more
            // with anyref type in case for flowing out. Here we create the
            // second 'flowing out' local in case two block's types are
            // different.
            if (type != blockType) {
              temp = builder.addVar(getFunction(), type);
              ourPreludes.push_back(builder.makeLocalSet(
                temp, ExpressionManipulator::copy(br->value, *getModule())));
            }

            if (br->condition) {
              // the value must also flow out
              ourPreludes.push_back(br);
              if (br->type.isConcrete()) {
                replaceCurrent(builder.makeLocalGet(temp, type));
              } else {
                assert(br->type == Type::unreachable);
                replaceCurrent(builder.makeUnreachable());
              }
            }
            br->value = nullptr;
            br->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(br->value);
          }
        }

      } else if (auto* sw = curr->dynCast<Switch>()) {
        if (sw->value) {
          auto type = sw->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Index temp = builder.addVar(getFunction(), type);
            ourPreludes.push_back(builder.makeLocalSet(temp, sw->value));
            // we don't know which break target will be hit - assign to them all
            auto names = BranchUtils::getUniqueTargets(sw);
            for (auto name : names) {
              ourPreludes.push_back(
                builder.makeLocalSet(getTempForBreakTarget(name, type),
                                     builder.makeLocalGet(temp, type)));
            }
            sw->value = nullptr;
            sw->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(sw->value);
          }
        }
      }
    }

    if (curr->is<BrOn>() || curr->is<TryTable>()) {
      Fatal() << "Unsupported instruction for Flatten: "
              << getExpressionName(curr);
    }

    // continue for general handling of everything, control flow or otherwise
    curr = getCurrent(); // we may have replaced it
    // we have changed children
    ReFinalizeNode().visit(curr);
    if (curr->type == Type::unreachable) {
      ourPreludes.push_back(curr);
      replaceCurrent(builder.makeUnreachable());
    } else if (curr->type.isConcrete()) {
      // use a local
      auto type = curr->type;
      Index temp = builder.addVar(getFunction(), type);
      ourPreludes.push_back(builder.makeLocalSet(temp, curr));
      replaceCurrent(builder.makeLocalGet(temp, type));
    }

    // next, finish up: migrate our preludes if we can
    if (!ourPreludes.empty()) {
      auto* parent = getParent();
      if (parent && !Properties::isControlFlowStructure(parent)) {
        auto& parentPreludes = preludes[parent];
        for (auto* prelude : ourPreludes) {
          parentPreludes.push_back(prelude);
        }
      } else {
        // keep our preludes, parent will handle them
        preludes[getCurrent()].swap(ourPreludes);
      }
    }
  }